

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O2

void __thiscall Text::draw(Text *this)

{
  (*glad_glDisable)(0xb50);
  (*glad_glEnable)(0xb71);
  (*glad_glDepthFunc)(0x201);
  (*glad_glEnable)(0xbe2);
  (*glad_glBlendFunc)(0x302,0x303);
  (*glad_glPushMatrix)();
  (*glad_glScalef)(this->scale,this->scale,1.0);
  (*glad_glRotatef)(this->rotationY,0.0,1.0,0.0);
  (*glad_glRotatef)(this->rotationX,1.0,0.0,0.0);
  _drawList(this);
  (*glad_glDisable)(0xbe2);
  return;
}

Assistant:

void Text::draw() {
    // Set OpenGL draw settings
    glDisable(GL_LIGHTING);
    glEnable(GL_DEPTH_TEST);
    glDepthFunc(GL_LESS);
    glEnable(GL_BLEND);
    glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
    // Not sure if I need these or not
    //glAlphaFunc(GL_GREATER, 0.f);
    //glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, GL_REPLACE);

    glPushMatrix();

    // Perform scaling and rotation
    //DEBUG_PRINTLN("Font scale: %f  windowScale: %f  xScale: %f  yScale: %f", scale, windowScale, scale * windowScale, scale * windowScale);
    //glScalef(scale * windowScale, scale * windowScale, 1.0);
    //glScalef(scale, scale, 1.0);
    glScalef(scale, scale, 1.0);
    glRotatef(rotationY, 0.0f, 1.0f, 0.0f);
    glRotatef(rotationX, 1.0f, 0.0f, 0.0f);

    _drawList();

    glDisable(GL_BLEND);
}